

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMatrix3x3.h
# Opt level: O2

cbtMatrix3x3 * cbtMatrix3x3::getIdentity(void)

{
  int iVar1;
  
  if (getIdentity()::identityMatrix == '\0') {
    iVar1 = __cxa_guard_acquire(&getIdentity()::identityMatrix);
    if (iVar1 != 0) {
      getIdentity::identityMatrix.m_el[0].m_floats[0] = 1.0;
      getIdentity::identityMatrix.m_el[0].m_floats[1] = 0.0;
      getIdentity::identityMatrix.m_el[0].m_floats[2] = 0.0;
      getIdentity::identityMatrix.m_el[0].m_floats[3] = 0.0;
      getIdentity::identityMatrix.m_el[1].m_floats[0] = 0.0;
      getIdentity::identityMatrix.m_el[1].m_floats[1] = 1.0;
      getIdentity::identityMatrix.m_el[1].m_floats[2] = 0.0;
      getIdentity::identityMatrix.m_el[1].m_floats[3] = 0.0;
      getIdentity::identityMatrix.m_el[2].m_floats[0] = 0.0;
      getIdentity::identityMatrix.m_el[2].m_floats[1] = 0.0;
      getIdentity::identityMatrix.m_el[2].m_floats._8_8_ =
           vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      __cxa_guard_release(&getIdentity()::identityMatrix);
    }
  }
  return &getIdentity::identityMatrix;
}

Assistant:

static const cbtMatrix3x3& getIdentity()
	{
#if (defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)) || defined(BT_USE_NEON)
		static const cbtMatrix3x3
			identityMatrix(v1000, v0100, v0010);
#else
		static const cbtMatrix3x3
			identityMatrix(
				cbtScalar(1.0), cbtScalar(0.0), cbtScalar(0.0),
				cbtScalar(0.0), cbtScalar(1.0), cbtScalar(0.0),
				cbtScalar(0.0), cbtScalar(0.0), cbtScalar(1.0));
#endif
		return identityMatrix;
	}